

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseTerm(Parser *this)

{
  variant_alternative_t<1UL,_variant<basic_string<char>,_double>_> vVar1;
  Mark MVar2;
  pointer pcVar3;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *__v;
  TokenType type;
  Mark *pMVar4;
  Token *pTVar5;
  variant_alternative_t<1UL,_variant<basic_string<char>,_double>_> *pvVar6;
  istream *piVar7;
  variant_alternative_t<0UL,_variant<basic_string<char>,_double>_> *pvVar8;
  pointer *__ptr;
  Tokenizer *in_RSI;
  Token identifierToken;
  Token token;
  Token local_190;
  anon_class_8_1_8991fb9c local_158;
  TokenType local_150;
  _Move_assign_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_148;
  Mark local_120;
  Token local_118;
  undefined1 local_e0 [56];
  bool local_a8;
  Token local_a0;
  Token local_68;
  
  pMVar4 = Stream::getMark(&in_RSI->stream_);
  MVar2 = *pMVar4;
  pTVar5 = Tokenizer::peek(in_RSI);
  local_150 = pTVar5->type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&local_148,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&pTVar5->value);
  local_120 = pTVar5->mark;
  if (local_150 != Identifier) {
    if (local_150 == Number) {
      Tokenizer::nextToken(&local_68,in_RSI);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [local_68.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                ((anon_class_1_0_00000001 *)&local_190,&local_68.value);
      local_68.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index = 0xff;
      pvVar6 = std::get<1ul,std::__cxx11::string,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_148);
      piVar7 = (istream *)operator_new(0x18);
      vVar1 = *pvVar6;
      *(undefined ***)piVar7 = &PTR__Node_001f4a48;
      *(variant_alternative_t<1UL,_variant<basic_string<char>,_double>_> *)(piVar7 + 0x10) = vVar1;
      *(Mark *)(piVar7 + 8) = MVar2;
      (this->tokenizer_).stream_.is_ = piVar7;
      goto LAB_00168084;
    }
    if (1 < local_150 - KeywordIf) {
      if (local_150 != LParen) {
        local_190._0_8_ =
             (long)&local_190.value.
                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u.
                    _M_first + 8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,"Expected number, identifier of function call!","");
        reportError((Parser *)in_RSI,(string *)&local_190);
      }
      Tokenizer::nextToken(&local_190,in_RSI);
      local_150 = local_190.type;
      local_118._0_8_ = &local_148;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [local_190.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                ((anon_class_8_1_8991fb9c *)&local_118,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)((long)&local_190 + 8U));
      local_120 = local_190.mark;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [local_190.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                ((anon_class_1_0_00000001 *)&local_118,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)((long)&local_190 + 8U));
      if (local_150 == Backslash) {
        parseLambdaCall(this,SUB81(in_RSI,0));
      }
      else {
        parseLogicalExpression(this);
        pTVar5 = Tokenizer::peek(in_RSI);
        if (pTVar5->type != RParen) {
          local_190._0_8_ =
               (long)&local_190.value.
                      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
                      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
                      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u.
                      _M_first + 8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"Expected closing parenthesis!","");
          reportError((Parser *)in_RSI,(string *)&local_190);
        }
        Tokenizer::nextToken(&local_a0,in_RSI);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
          ::_S_vtable._M_arr
          [local_a0.value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                  ((anon_class_1_0_00000001 *)&local_190,&local_a0.value);
        local_a0.value.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index = 0xff;
      }
      goto LAB_00168084;
    }
  }
  __v = (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         *)((long)&local_190 + 8);
  local_190.type = local_150;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)__v,(_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                            *)&local_148);
  local_190.mark = local_120;
  Tokenizer::nextToken(&local_118,in_RSI);
  local_150 = local_118.type;
  local_158.this = &local_148;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr
    [local_118.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
            (&local_158,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)((long)&local_118 + 8U));
  local_120 = local_118.mark;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr
    [local_118.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_158,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)((long)&local_118 + 8U));
  if (local_150 == LParen) {
    local_e0._0_4_ = local_190.type;
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(local_e0 + 8),
                      (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)__v);
    local_e0._48_4_ = local_190.mark.line;
    local_e0._52_4_ = local_190.mark.column;
    local_a8 = true;
    parseFunctionCall(this,(optional<Token> *)in_RSI);
    if (local_a8 == true) {
      std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_e0);
    }
  }
  else {
    pvVar8 = std::get<0ul,std::__cxx11::string,double>(__v);
    piVar7 = (istream *)operator_new(0x30);
    *(undefined8 *)(piVar7 + 8) = 1;
    *(undefined ***)piVar7 = &PTR__VariableNode_001f4e28;
    *(istream **)(piVar7 + 0x10) = piVar7 + 0x20;
    pcVar3 = (pvVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(piVar7 + 0x10),pcVar3,pcVar3 + pvVar8->_M_string_length);
    *(Mark *)(piVar7 + 8) = MVar2;
    (this->tokenizer_).stream_.is_ = piVar7;
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr
    [local_190.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_118,__v);
LAB_00168084:
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr
    [local_148.super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_190,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)&local_148);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseTerm()
{
  const auto mark = tokenizer_.getMark();
  auto token = tokenizer_.peek();
  if(token.type == TokenType::Number)
  {
    tokenizer_.nextToken();
    auto node = std::make_unique<NumericLiteralNode>(std::get<double>(token.value));
    node->setMark(mark);
    return node;
  }
  else if(token.type == TokenType::Identifier || Token::isSpecialFunction(token))
  {
    const auto identifierToken = token;
    token = tokenizer_.nextToken();
    if(token.type == TokenType::LParen)
      return parseFunctionCall(identifierToken);
    else
    {
      auto node = std::make_unique<VariableNode>(std::get<std::string>(identifierToken.value));
      node->setMark(mark);
      return node;
    }
  }
  else if(token.type == TokenType::LParen)
  {
    token = tokenizer_.nextToken();
    if(token.type == TokenType::Backslash)
      return parseLambdaCall(true);

    auto expr = parseLogicalExpression();
    if(tokenizer_.peek().type == TokenType::RParen)
    {
      tokenizer_.nextToken();
      return expr;
    }
    else
      reportError("Expected closing parenthesis!");
  }
  else
    reportError("Expected number, identifier of function call!");

  return nullptr;
}